

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
emplaceValue<QStyleSheetStyleCaches::Tampered<QFont>>
          (Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *this,Tampered<QFont> *args)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  Tampered<QFont> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleSheetStyleCaches::Tampered<QFont>::Tampered(&local_30,args);
  uVar2 = *(undefined8 *)(this + 8);
  *(undefined8 *)(this + 8) = local_30._0_8_;
  uVar1 = *(undefined4 *)(this + 0x10);
  *(undefined4 *)(this + 0x10) = local_30._8_4_;
  *(uint *)(this + 0x18) = local_30.resolveMask;
  local_30._0_8_ = uVar2;
  local_30._8_4_ = uVar1;
  QFont::~QFont(&local_30.oldWidgetValue);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }